

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O3

LLVMBBlock * dg::llvmdg::LLVMSlicer::createNewExitBB(LLVMDependenceGraph *graph)

{
  size_t *psVar1;
  LLVMContext *pLVar2;
  long lVar3;
  long lVar4;
  BBlock<dg::LLVMNode> *this;
  BasicBlock *this_00;
  Twine *this_01;
  Value *pVVar5;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *this_02;
  _List_node_base *p_Var6;
  IntegerType *pIVar7;
  undefined1 auVar8 [16];
  pair<std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>,_bool> pVar9;
  char *local_58 [4];
  undefined2 local_38;
  
  this = (BBlock<dg::LLVMNode> *)operator_new(0x208);
  BBlock<dg::LLVMNode>::BBlock(this,(LLVMNode *)0x0,(DependenceGraphT *)0x0);
  pLVar2 = (LLVMContext *)**(undefined8 **)(graph + 0x140);
  local_58[0] = "safe_return";
  local_38._0_1_ = CStringKind;
  local_38._1_1_ = EmptyKind;
  this_00 = (BasicBlock *)operator_new(0x40);
  llvm::BasicBlock::BasicBlock(this_00,pLVar2,(Twine *)local_58,(Function *)0x0,(BasicBlock *)0x0);
  lVar3 = **(long **)(graph + 0x18);
  llvm::SymbolTableListTraits<llvm::BasicBlock>::addNodeToList((BasicBlock *)(lVar3 + 0x48));
  lVar4 = *(long *)(lVar3 + 0x48);
  *(BasicBlock **)(this_00 + 0x20) = (BasicBlock *)(lVar3 + 0x48);
  *(long *)(this_00 + 0x18) = lVar4;
  *(BasicBlock **)(lVar4 + 8) = this_00 + 0x18;
  *(BasicBlock **)(lVar3 + 0x48) = this_00 + 0x18;
  if (*(char *)(**(long **)(*(long *)(lVar3 + 0x18) + 0x10) + 8) == '\a') {
    this_01 = (Twine *)llvm::User::operator_new(0x40,0);
    llvm::ReturnInst::ReturnInst((ReturnInst *)this_01,pLVar2,this_00);
  }
  else {
    auVar8 = llvm::Value::getName();
    if ((auVar8._8_8_ == 4) && (*auVar8._0_8_ == 0x6e69616d)) {
      pIVar7 = (IntegerType *)llvm::Type::getInt32Ty(pLVar2);
      pVVar5 = (Value *)llvm::ConstantInt::get(pIVar7,0,false);
    }
    else {
      pVVar5 = (Value *)llvm::UndefValue::get
                                  ((Type *)**(undefined8 **)(*(long *)(lVar3 + 0x18) + 0x10));
    }
    this_01 = (Twine *)llvm::User::operator_new(0x40,(uint)(pVVar5 != (Value *)0x0));
    llvm::ReturnInst::ReturnInst((ReturnInst *)this_01,pLVar2,pVVar5,this_00);
  }
  this_02 = (Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)operator_new(0x1f0);
  local_58[0] = (char *)this_01;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::Node(this_02,(Value **)local_58);
  this_02[1].key = (Value *)0x0;
  local_58[0] = (char *)this_02->key;
  local_58[1] = (char *)this_02;
  pVar9 = std::
          _Rb_tree<llvm::Value*,std::pair<llvm::Value*const,dg::LLVMNode*>,std::_Select1st<std::pair<llvm::Value*const,dg::LLVMNode*>>,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>
          ::_M_emplace_unique<std::pair<llvm::Value*,dg::LLVMNode*>>
                    ((_Rb_tree<llvm::Value*,std::pair<llvm::Value*const,dg::LLVMNode*>,std::_Select1st<std::pair<llvm::Value*const,dg::LLVMNode*>>,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>
                      *)(graph + 0xa8),(pair<llvm::Value_*,_dg::LLVMNode_*> *)local_58);
  if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    this_02->dg = graph;
  }
  this_02->basicBlock = this;
  p_Var6 = (_List_node_base *)operator_new(0x18);
  p_Var6[1]._M_next = (_List_node_base *)this_02;
  std::__detail::_List_node_base::_M_hook(p_Var6);
  psVar1 = &(this->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  this->key = (KeyT)this_00;
  this->dg = graph;
  return this;
}

Assistant:

static LLVMBBlock *createNewExitBB(LLVMDependenceGraph *graph) {
        using namespace llvm;

        LLVMBBlock *exitBB = new LLVMBBlock();

        Module *M = graph->getModule();
        LLVMContext &Ctx = M->getContext();
        BasicBlock *block = BasicBlock::Create(Ctx, "safe_return");

        Value *fval = graph->getEntry()->getKey();
        Function *F = cast<Function>(fval);
        F->getBasicBlockList().push_back(block);

        // fill in basic block just with return value
        ReturnInst *RI;
        if (F->getReturnType()->isVoidTy())
            RI = ReturnInst::Create(Ctx, block);
        else if (F->getName().equals("main"))
            // if this is main, than the safe exit equals to returning 0
            // (it is just for convenience, we wouldn't need to do this)
            RI = ReturnInst::Create(
                    Ctx, ConstantInt::get(Type::getInt32Ty(Ctx), 0), block);
        else
            RI = ReturnInst::Create(Ctx, UndefValue::get(F->getReturnType()),
                                    block);

        LLVMNode *newRet = new LLVMNode(RI);
        graph->addNode(newRet);

        exitBB->append(newRet);
        exitBB->setKey(block);
        exitBB->setDG(graph);

        return exitBB;
    }